

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlelement.c
# Opt level: O1

size_t EBML_FillBufferID(uint8_t *Buffer,size_t BufSize,fourcc_t Id)

{
  size_t sVar1;
  byte bVar2;
  size_t sVar3;
  
  sVar1 = 1;
  if ((0xff < Id) && (sVar1 = 2, 0xffff < Id)) {
    sVar1 = 4 - (ulong)(Id < 0x1000000);
  }
  bVar2 = 0;
  sVar3 = sVar1;
  if (sVar1 <= BufSize) {
    do {
      Buffer[sVar3 - 1] = (uint8_t)(Id >> (bVar2 & 0x1f));
      bVar2 = bVar2 + 8;
      sVar3 = sVar3 - 1;
    } while (sVar3 != 0);
    return sVar1;
  }
  return 0;
}

Assistant:

size_t EBML_FillBufferID(uint8_t *Buffer, size_t BufSize, fourcc_t Id)
{
    size_t i,FinalHeadSize = GetIdLength(Id);
    if (BufSize < FinalHeadSize)
        return 0;
    for (i=0;i<FinalHeadSize;++i)
        Buffer[FinalHeadSize-i-1] = (uint8_t)(Id >> (i<<3));
    return FinalHeadSize;
}